

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O0

void __thiscall MiniScript::TestParser::TestValidParse(TestParser *this,String *src,bool dumpTac)

{
  MiniscriptException *e;
  String local_c0;
  undefined1 local_b0 [8];
  Parser parser;
  bool dumpTac_local;
  String *src_local;
  TestParser *this_local;
  
  parser._143_1_ = dumpTac;
  Parser::Parser((Parser *)local_b0);
  String::String(&local_c0,src);
  Parser::Parse((Parser *)local_b0,&local_c0,false);
  String::~String(&local_c0);
  Parser::~Parser((Parser *)local_b0);
  return;
}

Assistant:

void TestParser::TestValidParse(String src, bool dumpTac) {
		Parser parser;
		try {
			parser.Parse(src);
		} catch (MiniscriptException& e) {
			std::cerr << e.Description().c_str() << " while parsing:" << std::endl;
			std::cerr << src.c_str() << std::endl;
		}
//		if (dumpTac && parser.output != null) TAC.Dump(parser.output.code);
	}